

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.h
# Opt level: O2

bool __thiscall
jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies::operator==
          (PerOperationSamplingStrategies *this,PerOperationSamplingStrategies *rhs)

{
  bool bVar1;
  
  if ((*(double *)(this + 8) != *(double *)(rhs + 8)) ||
     (NAN(*(double *)(this + 8)) || NAN(*(double *)(rhs + 8)))) {
    return false;
  }
  if ((((*(double *)(this + 0x10) == *(double *)(rhs + 0x10)) &&
       (!NAN(*(double *)(this + 0x10)) && !NAN(*(double *)(rhs + 0x10)))) &&
      (bVar1 = std::operator==((vector<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
                                *)(this + 0x18),
                               (vector<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
                                *)(rhs + 0x18)), bVar1)) &&
     ((((byte)rhs[0x38] ^ (byte)this[0x38]) & 1) == 0)) {
    if (((byte)this[0x38] & 1) != 0) {
      if (*(double *)(this + 0x30) != *(double *)(rhs + 0x30)) {
        return false;
      }
      if (NAN(*(double *)(this + 0x30)) || NAN(*(double *)(rhs + 0x30))) {
        return false;
      }
    }
    return true;
  }
  return false;
}

Assistant:

bool operator == (const PerOperationSamplingStrategies & rhs) const
  {
    if (!(defaultSamplingProbability == rhs.defaultSamplingProbability))
      return false;
    if (!(defaultLowerBoundTracesPerSecond == rhs.defaultLowerBoundTracesPerSecond))
      return false;
    if (!(perOperationStrategies == rhs.perOperationStrategies))
      return false;
    if (__isset.defaultUpperBoundTracesPerSecond != rhs.__isset.defaultUpperBoundTracesPerSecond)
      return false;
    else if (__isset.defaultUpperBoundTracesPerSecond && !(defaultUpperBoundTracesPerSecond == rhs.defaultUpperBoundTracesPerSecond))
      return false;
    return true;
  }